

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetHB.c
# Opt level: O0

DdNode * cuddSubsetHeavyBranch(DdManager *dd,DdNode *f,int numVars,int threshold)

{
  int iVar1;
  st__table *table;
  DdNode *key_00;
  st__generator *psVar2;
  st__generator *stGen;
  char *value;
  char *key;
  st__table *approxTable;
  st__table *storeTable;
  DdNode *subset;
  NodeData_t *currNodeQual;
  st__table *psStack_40;
  int numNodes;
  st__table *visitedTable;
  int *size;
  int local_28;
  int i;
  int threshold_local;
  int numVars_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  local_28 = threshold;
  i = numVars;
  _threshold_local = (DdManager *)f;
  f_local = &dd->sentinel;
  if (f == (DdNode *)0x0) {
    fprintf((FILE *)dd->err,"Cannot subset, nil object\n");
    *(undefined4 *)((long)&f_local[0xf].type + 8) = 4;
    dd_local = (DdManager *)0x0;
  }
  else {
    one = Cudd_ReadOne(dd);
    zero = (DdNode *)((ulong)one ^ 1);
    if (i == 0) {
      i = 0x3ff;
    }
    if (*(int *)((ulong)_threshold_local & 0xfffffffffffffffe) == 0x7fffffff) {
      dd_local = _threshold_local;
    }
    else {
      max = pow(2.0,(double)i);
      psStack_40 = SubsetCountMinterm(&_threshold_local->sentinel,i);
      if ((psStack_40 == (st__table *)0x0) || (memOut != 0)) {
        fprintf((FILE *)f_local[0xf].type.kids.T,"Out-of-memory; Cannot subset\n");
        *(undefined4 *)((long)&f_local[0xf].type + 8) = 1;
        dd_local = (DdManager *)0x0;
      }
      else {
        currNodeQual._4_4_ = SubsetCountNodes(&_threshold_local->sentinel,psStack_40,i);
        if (memOut == 0) {
          iVar1 = st__lookup(psStack_40,(char *)_threshold_local,(char **)&subset);
          if (iVar1 == 0) {
            fprintf((FILE *)f_local[0xf].type.kids.T,
                    "Something is wrong, ought to be node quality table\n");
            *(undefined4 *)((long)&f_local[0xf].type + 8) = 5;
          }
          visitedTable = (st__table *)malloc(4);
          if (visitedTable == (st__table *)0x0) {
            *(undefined4 *)((long)&f_local[0xf].type + 8) = 1;
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)&visitedTable->compare = currNodeQual._4_4_;
            table = st__init_table(st__ptrcmp,st__ptrhash);
            *(int *)(((ulong)one & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)one & 0xfffffffffffffffe) + 4) + 1;
            approxTable = table;
            key_00 = Cudd_ReadOne((DdManager *)f_local);
            iVar1 = st__insert(table,(char *)key_00,(char *)0x0);
            if (iVar1 == -10000) {
              fprintf((FILE *)f_local[0xf].next,"Something wrong, st__table insert failed\n");
            }
            key = (char *)st__init_table(st__ptrcmp,st__ptrhash);
            storeTable = (st__table *)
                         BuildSubsetBdd((DdManager *)f_local,&_threshold_local->sentinel,
                                        (int *)visitedTable,psStack_40,local_28,approxTable,
                                        (st__table *)key);
            if (storeTable != (st__table *)0x0) {
              *(int *)(((ulong)storeTable & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)storeTable & 0xfffffffffffffffe) + 4) + 1;
            }
            psVar2 = st__init_gen((st__table *)key);
            if (psVar2 == (st__generator *)0x0) {
              st__free_table((st__table *)key);
              dd_local = (DdManager *)0x0;
            }
            else {
              while (iVar1 = st__gen(psVar2,&value,(char **)&stGen), iVar1 != 0) {
                Cudd_RecursiveDeref((DdManager *)f_local,(DdNode *)stGen);
              }
              st__free_gen(psVar2);
              st__free_table((st__table *)key);
              psVar2 = st__init_gen(approxTable);
              if (psVar2 == (st__generator *)0x0) {
                st__free_table(approxTable);
                dd_local = (DdManager *)0x0;
              }
              else {
                while (iVar1 = st__gen(psVar2,&value,(char **)&stGen), iVar1 != 0) {
                  Cudd_RecursiveDeref((DdManager *)f_local,(DdNode *)value);
                }
                st__free_gen(psVar2);
                st__free_table(approxTable);
                for (size._4_4_ = 0; size._4_4_ <= page; size._4_4_ = size._4_4_ + 1) {
                  if (mintermPages[size._4_4_] != (double *)0x0) {
                    free(mintermPages[size._4_4_]);
                    mintermPages[size._4_4_] = (double *)0x0;
                  }
                }
                if (mintermPages != (double **)0x0) {
                  free(mintermPages);
                  mintermPages = (double **)0x0;
                }
                for (size._4_4_ = 0; size._4_4_ <= page; size._4_4_ = size._4_4_ + 1) {
                  if (nodePages[size._4_4_] != (int *)0x0) {
                    free(nodePages[size._4_4_]);
                    nodePages[size._4_4_] = (int *)0x0;
                  }
                }
                if (nodePages != (int **)0x0) {
                  free(nodePages);
                  nodePages = (int **)0x0;
                }
                for (size._4_4_ = 0; size._4_4_ <= page; size._4_4_ = size._4_4_ + 1) {
                  if (lightNodePages[size._4_4_] != (int *)0x0) {
                    free(lightNodePages[size._4_4_]);
                    lightNodePages[size._4_4_] = (int *)0x0;
                  }
                }
                if (lightNodePages != (int **)0x0) {
                  free(lightNodePages);
                  lightNodePages = (int **)0x0;
                }
                for (size._4_4_ = 0; size._4_4_ <= nodeDataPage; size._4_4_ = size._4_4_ + 1) {
                  if (nodeDataPages[size._4_4_] != (NodeData_t *)0x0) {
                    free(nodeDataPages[size._4_4_]);
                    nodeDataPages[size._4_4_] = (NodeData_t *)0x0;
                  }
                }
                if (nodeDataPages != (NodeData_t **)0x0) {
                  free(nodeDataPages);
                  nodeDataPages = (NodeData_t **)0x0;
                }
                st__free_table(psStack_40);
                if (visitedTable != (st__table *)0x0) {
                  free(visitedTable);
                }
                if (storeTable == (st__table *)0x0) {
                  dd_local = (DdManager *)0x0;
                }
                else {
                  *(int *)(((ulong)storeTable & 0xfffffffffffffffe) + 4) =
                       *(int *)(((ulong)storeTable & 0xfffffffffffffffe) + 4) + -1;
                  dd_local = (DdManager *)storeTable;
                }
              }
            }
          }
        }
        else {
          fprintf((FILE *)f_local[0xf].type.kids.T,"Out-of-memory; Cannot subset\n");
          *(undefined4 *)((long)&f_local[0xf].type + 8) = 1;
          dd_local = (DdManager *)0x0;
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
cuddSubsetHeavyBranch(
  DdManager * dd /* DD manager */,
  DdNode * f /* current DD */,
  int  numVars /* maximum number of variables */,
  int  threshold /* threshold size for the subset */)
{

    int i, *size;
    st__table *visitedTable;
    int numNodes;
    NodeData_t *currNodeQual;
    DdNode *subset;
    st__table *storeTable, *approxTable;
    char *key, *value;
    st__generator *stGen;

    if (f == NULL) {
        fprintf(dd->err, "Cannot subset, nil object\n");
        dd->errorCode = CUDD_INVALID_ARG;
        return(NULL);
    }

    one  = Cudd_ReadOne(dd);
    zero = Cudd_Not(one);

    /* If user does not know numVars value, set it to the maximum
     * exponent that the pow function can take. The -1 is due to the
     * discrepancy in the value that pow takes and the value that
     * log gives.
     */
    if (numVars == 0) {
        /* set default value */
        numVars = DBL_MAX_EXP - 1;
    }

    if (Cudd_IsConstant(f)) {
        return(f);
    }

    max = pow(2.0, (double)numVars);

    /* Create visited table where structures for node data are allocated and
       stored in a st__table */
    visitedTable = SubsetCountMinterm(f, numVars);
    if ((visitedTable == NULL) || memOut) {
        (void) fprintf(dd->err, "Out-of-memory; Cannot subset\n");
        dd->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    numNodes = SubsetCountNodes(f, visitedTable, numVars);
    if (memOut) {
        (void) fprintf(dd->err, "Out-of-memory; Cannot subset\n");
        dd->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }

    if ( st__lookup(visitedTable, (const char *)f, (char **)&currNodeQual) == 0) {
        fprintf(dd->err,
                "Something is wrong, ought to be node quality table\n");
        dd->errorCode = CUDD_INTERNAL_ERROR;
    }

    size = ABC_ALLOC(int, 1);
    if (size == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    *size = numNodes;

#ifdef DEBUG
    num_calls = 0;
#endif
    /* table to store nodes being created. */
    storeTable = st__init_table( st__ptrcmp, st__ptrhash);
    /* insert the constant */
    cuddRef(one);
    if ( st__insert(storeTable, (char *)Cudd_ReadOne(dd), NIL(char)) ==
        st__OUT_OF_MEM) {
        fprintf(dd->out, "Something wrong, st__table insert failed\n");
    }
    /* table to store approximations of nodes */
    approxTable = st__init_table( st__ptrcmp, st__ptrhash);
    subset = (DdNode *)BuildSubsetBdd(dd, f, size, visitedTable, threshold,
                                      storeTable, approxTable);
    if (subset != NULL) {
        cuddRef(subset);
    }

    stGen = st__init_gen(approxTable);
    if (stGen == NULL) {
        st__free_table(approxTable);
        return(NULL);
    }
    while( st__gen(stGen, (const char **)&key, (char **)&value)) {
        Cudd_RecursiveDeref(dd, (DdNode *)value);
    }
    st__free_gen(stGen); stGen = NULL;
    st__free_table(approxTable);

    stGen = st__init_gen(storeTable);
    if (stGen == NULL) {
        st__free_table(storeTable);
        return(NULL);
    }
    while( st__gen(stGen, (const char **)&key, (char **)&value)) {
        Cudd_RecursiveDeref(dd, (DdNode *)key);
    }
    st__free_gen(stGen); stGen = NULL;
    st__free_table(storeTable);

    for (i = 0; i <= page; i++) {
        ABC_FREE(mintermPages[i]);
    }
    ABC_FREE(mintermPages);
    for (i = 0; i <= page; i++) {
        ABC_FREE(nodePages[i]);
    }
    ABC_FREE(nodePages);
    for (i = 0; i <= page; i++) {
        ABC_FREE(lightNodePages[i]);
    }
    ABC_FREE(lightNodePages);
    for (i = 0; i <= nodeDataPage; i++) {
        ABC_FREE(nodeDataPages[i]);
    }
    ABC_FREE(nodeDataPages);
    st__free_table(visitedTable);
    ABC_FREE(size);
#if 0
    (void) Cudd_DebugCheck(dd);
    (void) Cudd_CheckKeys(dd);
#endif

    if (subset != NULL) {
#ifdef DD_DEBUG
      if (!Cudd_bddLeq(dd, subset, f)) {
            fprintf(dd->err, "Wrong subset\n");
            dd->errorCode = CUDD_INTERNAL_ERROR;
            return(NULL);
      }
#endif
        cuddDeref(subset);
        return(subset);
    } else {
        return(NULL);
    }
}